

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O2

void __thiscall UDMFParser::ParseSector(UDMFParser *this,sector_t *sec,int index)

{
  int *piVar1;
  double dVar2;
  FName FVar3;
  bool bVar4;
  ushort uVar5;
  short sVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  long lVar11;
  FDynamicColormap *pFVar12;
  anon_union_4_2_12391d7c_for_PalEntry_0 color;
  uint local_20c;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_1fc;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_1f8;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_1f4;
  FString tagstring;
  FString local_1e0;
  FName local_1d4;
  FName local_1d0;
  FName local_1cc;
  DWORD *local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  sector_t *local_180;
  FNameNoInit *local_178;
  FNameNoInit *local_170;
  WORD *local_168;
  undefined1 local_160 [8];
  undefined1 local_158 [8];
  TVector3<double> local_150;
  FName key;
  int iStack_134;
  FString FStack_130;
  int local_128;
  undefined4 uStack_124;
  
  tagstring.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  memset(sec,0,0x268);
  sec->lightlevel = 0xa0;
  sec->planes[0].xform.xScale = 1.0;
  sec->planes[0].xform.yScale = 1.0;
  sec->planes[1].xform.xScale = 1.0;
  sec->planes[1].xform.yScale = 1.0;
  sec->planes[0].alpha = 1.0;
  sec->planes[1].alpha = 1.0;
  sec->touching_thinglist = (msecnode_t *)0x0;
  sec->render_thinglist = (msecnode_t *)0x0;
  sec->seqType = ((level.flags >> 0xc & 1) != 0) - 1;
  sec->prevsec = -1;
  sec->nextsec = -1;
  sec->sectornum = index;
  sec->damageinterval = 0x20;
  sec->terrainnum[0] = -1;
  sec->terrainnum[1] = -1;
  if (this->floordrop == true) {
    sec->Flags = 4;
  }
  sec->gravity = 1.0;
  sec->ZoneNumber = 0xffff;
  sec->friction = 0.90625;
  sec->movefactor = 0.03125;
  FScanner::MustGetToken((FScanner *)this,0x7b);
  local_1c8 = &sec->Flags;
  local_170 = &sec->damagetype;
  local_168 = &sec->MoreFlags;
  local_178 = &sec->SeqName;
  local_188 = 0.0;
  uVar9 = 0;
  local_190 = 0.0;
  local_198 = 0.0;
  local_1b8 = 0.0;
  local_1a0 = 0.0;
  local_1a8 = 0.0;
  local_1b0 = 0.0;
  local_1c0 = 0.0;
  local_20c = 0;
  local_1fc.d = 0xffffffff;
  local_1f8.d = local_1fc.d;
  local_1f4.d = local_1fc.d;
  local_180 = sec;
LAB_004e6b60:
  do {
    bVar4 = FScanner::CheckToken((FScanner *)this,0x7d);
    if (bVar4) {
      if (*(int *)(tagstring.Chars + -0xc) != 0) {
        FScanner::FScanner((FScanner *)&key);
        FString::AttachToOther(&local_1e0,&tagstring);
        FScanner::OpenString((FScanner *)&key,"tagstring",&local_1e0);
        FString::~FString(&local_1e0);
        while (bVar4 = FScanner::CheckNumber((FScanner *)&key), bVar4) {
          if (local_128 != 0) {
            FTagManager::AddSectorTag(&tagManager,index,local_128);
          }
        }
        FScanner::~FScanner((FScanner *)&key);
      }
      if (sec->damageamount == 0) {
        (sec->damagetype).super_FName.Index = 0;
        sec->damageinterval = 0;
        sec->leakydamage = 0;
        sec->Flags = sec->Flags & 0xfffff87f;
      }
      if (uVar9 == 0xf) {
        local_150.X = local_188;
        local_150.Y = local_190;
        local_150.Z = local_198;
        TVector3<double>::Unit((TVector3<double> *)&key,&local_150);
        (sec->floorplane).normal.X = (double)CONCAT44(iStack_134,key.Index);
        (sec->floorplane).normal.Y = (double)FStack_130.Chars;
        (sec->floorplane).normal.Z = (double)CONCAT44(uStack_124,local_128);
        (sec->floorplane).D = local_1b8;
        (sec->floorplane).negiC = -1.0 / (double)CONCAT44(uStack_124,local_128);
      }
      else {
        (sec->floorplane).normal.X = 0.0;
        (sec->floorplane).normal.Y = 0.0;
        dVar2 = sec->planes[0].TexZ;
        (sec->floorplane).normal.Z = 1.0;
        (sec->floorplane).negiC = -1.0;
        (sec->floorplane).D = -dVar2;
      }
      if (local_20c == 0xf) {
        local_150.X = local_1a0;
        local_150.Y = local_1a8;
        local_150.Z = local_1b0;
        TVector3<double>::Unit((TVector3<double> *)&key,&local_150);
        (sec->ceilingplane).normal.X = (double)CONCAT44(iStack_134,key.Index);
        (sec->ceilingplane).normal.Y = (double)FStack_130.Chars;
        (sec->ceilingplane).normal.Z = (double)CONCAT44(uStack_124,local_128);
        (sec->ceilingplane).D = local_1c0;
        (sec->ceilingplane).negiC = -1.0 / (double)CONCAT44(uStack_124,local_128);
      }
      else {
        dVar2 = sec->planes[1].TexZ;
        (sec->ceilingplane).normal.X = 0.0;
        (sec->ceilingplane).normal.Y = 0.0;
        (sec->ceilingplane).normal.Z = -1.0;
        (sec->ceilingplane).negiC = 1.0;
        (sec->ceilingplane).D = dVar2;
      }
      if (((local_1f4.d == 0xffffffff) && (local_1fc.d == 0xffffffff)) &&
         (local_1f8.d == 0xffffffff)) {
        if ((level.outsidefog == 0xff000000) ||
           ((sec->planes[1].Texture.texnum != skyflatnum.texnum && ((char)sec->special != 'W')))) {
          pFVar12 = this->normMap;
          if (pFVar12 == (FDynamicColormap *)0x0) {
            pFVar12 = GetSpecialLights((PalEntry)0xffffff,(PalEntry)level.fadeto,
                                       NormalLight.Desaturate);
            this->normMap = pFVar12;
          }
        }
        else {
          pFVar12 = this->fogMap;
          if (pFVar12 == (FDynamicColormap *)0x0) {
            pFVar12 = GetSpecialLights((PalEntry)0xffffff,(PalEntry)level.outsidefog,0);
            this->fogMap = pFVar12;
          }
        }
      }
      else {
        color.d = 0xffffff;
        if (local_1f4.d != 0xffffffff) {
          color = local_1f4;
        }
        if ((local_1fc.d == 0xffffffff) &&
           ((level.outsidefog == 0xff000000 ||
            ((local_1fc = (anon_union_4_2_12391d7c_for_PalEntry_0)level.outsidefog,
             sec->planes[1].Texture.texnum != skyflatnum.texnum && ((char)sec->special != 'W'))))))
        {
          local_1fc = (anon_union_4_2_12391d7c_for_PalEntry_0)level.fadeto;
        }
        if (local_1f8.d == 0xffffffff) {
          local_1f8 = (anon_union_4_2_12391d7c_for_PalEntry_0)NormalLight.Desaturate;
        }
        pFVar12 = GetSpecialLights((PalEntry)color.field_0,(PalEntry)local_1fc,local_1f8.d);
      }
      sec->ColorMap = pFVar12;
      FString::~FString(&tagstring);
      return;
    }
    UDMFParserBase::ParseKey((UDMFParserBase *)&key,SUB81(this,0),(bool *)0x0);
    switch(key.Index) {
    case 0x11f:
      dVar2 = UDMFParserBase::CheckFloat
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[0x11f].Text);
      sec->planes[0].TexZ = dVar2;
      goto LAB_004e6b60;
    case 0x120:
      dVar2 = UDMFParserBase::CheckFloat
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[0x120].Text);
      sec->planes[1].TexZ = dVar2;
      goto LAB_004e6b60;
    case 0x121:
      iVar7 = UDMFParserBase::CheckInt
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[0x121].Text);
      if (0x7ffe < iVar7) {
        iVar7 = 0x7fff;
      }
      sVar6 = (short)iVar7;
      if (iVar7 < -0x7fff) {
        sVar6 = -0x8000;
      }
      sec->lightlevel = sVar6;
      goto LAB_004e6b60;
    case 0x122:
      pcVar10 = UDMFParserBase::CheckString
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x122].Text);
      iVar7 = 0;
      goto LAB_004e6c9b;
    case 0x123:
      pcVar10 = UDMFParserBase::CheckString
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x123].Text);
      iVar7 = 1;
LAB_004e6c9b:
      SetTexture(sec,index,iVar7,pcVar10,this->missingTex,false);
      goto LAB_004e6b60;
    }
    if (key.Index == 0xe6) break;
    if (key.Index != 0x113) {
      if (((this->super_UDMFParserBase).namespace_bits & 0x70) == 0)
      goto switchD_004e6ce3_caseD_19c;
      switch(key.Index) {
      case 0x180:
        dVar2 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x180].Text);
        sec->planes[0].xform.xOffs = dVar2;
        goto LAB_004e6b60;
      case 0x181:
        dVar2 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x181].Text);
        sec->planes[0].xform.yOffs = dVar2;
        goto LAB_004e6b60;
      case 0x182:
        dVar2 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x182].Text);
        sec->planes[1].xform.xOffs = dVar2;
        goto LAB_004e6b60;
      case 0x183:
        dVar2 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x183].Text);
        sec->planes[1].xform.yOffs = dVar2;
        goto LAB_004e6b60;
      case 0x184:
        dVar2 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x184].Text);
        sec->planes[0].xform.xScale = dVar2;
        goto LAB_004e6b60;
      case 0x185:
        dVar2 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x185].Text);
        sec->planes[0].xform.yScale = dVar2;
        goto LAB_004e6b60;
      case 0x186:
        dVar2 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x186].Text);
        sec->planes[1].xform.xScale = dVar2;
        goto LAB_004e6b60;
      case 0x187:
        dVar2 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x187].Text);
        sec->planes[1].xform.yScale = dVar2;
        goto LAB_004e6b60;
      case 0x188:
        UDMFParserBase::CheckAngle((UDMFParserBase *)local_158,(char *)this);
        sec->planes[0].xform.Angle.Degrees = (double)local_158;
        goto LAB_004e6b60;
      case 0x189:
        UDMFParserBase::CheckAngle((UDMFParserBase *)local_160,(char *)this);
        sec->planes[1].xform.Angle.Degrees = (double)local_160;
        goto LAB_004e6b60;
      case 0x18a:
        iVar7 = UDMFParserBase::CheckInt
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x18a].Text);
        sec->planes[0].Light = iVar7;
        goto LAB_004e6b60;
      case 0x18b:
        iVar7 = UDMFParserBase::CheckInt
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x18b].Text);
        sec->planes[1].Light = iVar7;
        goto LAB_004e6b60;
      case 0x18c:
        bVar4 = UDMFParserBase::CheckBool
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x18c].Text);
        uVar8 = sec->planes[0].Flags;
        if (bVar4) {
          sec->planes[0].Flags = uVar8 | 1;
        }
        else {
          sec->planes[0].Flags = uVar8 & 0xfffffffe;
        }
        goto LAB_004e6b60;
      case 0x18d:
        bVar4 = UDMFParserBase::CheckBool
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x18d].Text);
        uVar8 = sec->planes[1].Flags;
        if (bVar4) {
          sec->planes[1].Flags = uVar8 | 1;
        }
        else {
          sec->planes[1].Flags = uVar8 & 0xfffffffe;
        }
        goto LAB_004e6b60;
      case 0x18e:
        dVar2 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x18e].Text);
        sec->gravity = dVar2;
        goto LAB_004e6b60;
      case 399:
        local_1f4.d = UDMFParserBase::CheckInt
                                (&this->super_UDMFParserBase,FName::NameData.NameArray[399].Text);
        goto LAB_004e6b60;
      case 400:
        local_1fc.d = UDMFParserBase::CheckInt
                                (&this->super_UDMFParserBase,FName::NameData.NameArray[400].Text);
        goto LAB_004e6b60;
      case 0x191:
        dVar2 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x191].Text);
        local_1f8.d = (uint32)(dVar2 * 255.0);
        goto LAB_004e6b60;
      case 0x192:
        pcVar10 = UDMFParserBase::CheckString
                            (&this->super_UDMFParserBase,FName::NameData.NameArray[0x192].Text);
        FNameNoInit::operator=(local_178,pcVar10);
        sec->seqType = -1;
        goto LAB_004e6b60;
      case 0x193:
        lVar11 = 0x1930;
        iVar7 = 1;
        goto LAB_004e72ed;
      case 0x194:
        lVar11 = 0x1940;
        iVar7 = 2;
        goto LAB_004e72ed;
      case 0x195:
        iVar7 = 4;
        lVar11 = 0x1950;
        goto LAB_004e72ed;
      case 0x196:
        iVar7 = 8;
        lVar11 = 0x1960;
LAB_004e72ed:
        UDMFParserBase::Flag<unsigned_int>
                  (&this->super_UDMFParserBase,local_1c8,iVar7,
                   *(char **)((long)&(FName::NameData.NameArray)->Text + lVar11));
        goto LAB_004e6b60;
      case 0x197:
        dVar2 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x197].Text);
        sec->planes[0].alpha = dVar2;
        goto LAB_004e6b60;
      case 0x198:
        dVar2 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x198].Text);
        sec->planes[1].alpha = dVar2;
        goto LAB_004e6b60;
      case 0x199:
        pcVar10 = UDMFParserBase::CheckString
                            (&this->super_UDMFParserBase,FName::NameData.NameArray[0x199].Text);
        iVar7 = strcasecmp(pcVar10,"translucent");
        if (iVar7 == 0) {
          piVar1 = &sec->planes[0].Flags;
          *(byte *)piVar1 = (byte)*piVar1 & 0xfb;
        }
        else {
          iVar7 = strcasecmp(pcVar10,"add");
          if (iVar7 == 0) {
            piVar1 = &sec->planes[0].Flags;
            *(byte *)piVar1 = (byte)*piVar1 | 4;
          }
          else {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Unknown value \"%s\" for \'renderstylefloor\'\n",pcVar10);
          }
        }
        goto LAB_004e6b60;
      case 0x19a:
        pcVar10 = UDMFParserBase::CheckString
                            (&this->super_UDMFParserBase,FName::NameData.NameArray[0x19a].Text);
        iVar7 = strcasecmp(pcVar10,"translucent");
        if (iVar7 == 0) {
          piVar1 = &sec->planes[1].Flags;
          *(byte *)piVar1 = (byte)*piVar1 & 0xfb;
        }
        else {
          iVar7 = strcasecmp(pcVar10,"add");
          if (iVar7 == 0) {
            piVar1 = &sec->planes[1].Flags;
            *(byte *)piVar1 = (byte)*piVar1 | 4;
          }
          else {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Unknown value \"%s\" for \'renderstyleceiling\'\n",pcVar10)
            ;
          }
        }
        goto LAB_004e6b60;
      case 0x19b:
        iVar7 = 0x20;
        lVar11 = 0x19b0;
        goto LAB_004e72c8;
      case 0x19c:
      case 0x19d:
      case 0x19e:
      case 0x19f:
      case 0x1a0:
      case 0x1a1:
      case 0x1a2:
      case 0x1a3:
      case 0x1a4:
      case 0x1a5:
      case 0x1a6:
      case 0x1a7:
      case 0x1a8:
      case 0x1a9:
      case 0x1aa:
      case 0x1ab:
      case 0x1ac:
      case 0x1ad:
      case 0x1ae:
      case 0x1b0:
      case 0x1b1:
      case 0x1b2:
        break;
      case 0x1af:
        iVar7 = 0x100;
        lVar11 = 0x1af0;
LAB_004e72c8:
        UDMFParserBase::Flag<unsigned_short>
                  (&this->super_UDMFParserBase,local_168,iVar7,
                   *(char **)((long)&(FName::NameData.NameArray)->Text + lVar11));
        break;
      case 0x1b3:
        local_1a0 = UDMFParserBase::CheckFloat
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1b3].Text);
        local_20c = local_20c | 1;
        break;
      case 0x1b4:
        local_1a8 = UDMFParserBase::CheckFloat
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1b4].Text);
        local_20c = local_20c | 2;
        break;
      case 0x1b5:
        local_1b0 = UDMFParserBase::CheckFloat
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1b5].Text);
        local_20c = local_20c | 4;
        break;
      case 0x1b6:
        local_1c0 = UDMFParserBase::CheckFloat
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1b6].Text);
        local_20c = local_20c | 8;
        break;
      case 0x1b7:
        local_188 = UDMFParserBase::CheckFloat
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1b7].Text);
        uVar9 = uVar9 | 1;
        break;
      case 0x1b8:
        local_190 = UDMFParserBase::CheckFloat
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1b8].Text);
        uVar9 = uVar9 | 2;
        break;
      case 0x1b9:
        local_198 = UDMFParserBase::CheckFloat
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1b9].Text);
        uVar9 = uVar9 | 4;
        break;
      case 0x1ba:
        local_1b8 = UDMFParserBase::CheckFloat
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1ba].Text);
        uVar9 = uVar9 | 8;
        break;
      case 0x1bb:
        iVar7 = UDMFParserBase::CheckInt
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1bb].Text);
        sec->damageamount = iVar7;
        break;
      case 0x1bc:
        pcVar10 = UDMFParserBase::CheckString
                            (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1bc].Text);
        FNameNoInit::operator=(local_170,pcVar10);
        break;
      case 0x1bd:
        iVar7 = UDMFParserBase::CheckInt
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1bd].Text);
        sVar6 = 1;
        if (1 < (short)iVar7) {
          sVar6 = (short)iVar7;
        }
        sec->damageinterval = sVar6;
        break;
      case 0x1be:
        iVar7 = UDMFParserBase::CheckInt
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1be].Text);
        sec->leakydamage = (short)iVar7;
        break;
      case 0x1bf:
        iVar7 = 0x80;
        lVar11 = 0x1bf0;
        goto LAB_004e73a7;
      case 0x1c0:
        iVar7 = 0x400;
        lVar11 = 0x1c00;
LAB_004e73a7:
        UDMFParserBase::Flag<unsigned_int>
                  (&this->super_UDMFParserBase,local_1c8,iVar7,
                   *(char **)((long)&(FName::NameData.NameArray)->Text + lVar11));
        break;
      case 0x1c1:
        pcVar10 = UDMFParserBase::CheckString
                            (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1c1].Text);
        FName::FName(&local_1cc,pcVar10);
        iVar7 = P_FindTerrain(&local_1cc);
        sec->terrainnum[0] = iVar7;
        break;
      case 0x1c2:
        pcVar10 = UDMFParserBase::CheckString
                            (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1c2].Text);
        FName::FName(&local_1d0,pcVar10);
        iVar7 = P_FindTerrain(&local_1d0);
        sec->terrainnum[1] = iVar7;
        break;
      default:
        if (key.Index == 0x114) {
          pcVar10 = UDMFParserBase::CheckString
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x114].Text);
          FString::operator=(&tagstring,pcVar10);
        }
      }
switchD_004e6ce3_caseD_19c:
      FVar3.Index = key.Index;
      if ((((this->super_UDMFParserBase).namespace_bits & 0x30) != 0) &&
         (iVar7 = strncasecmp("user_",FName::NameData.NameArray[key.Index].Text,5), sec = local_180,
         iVar7 == 0)) {
        local_1d4.Index = FVar3.Index;
        AddUserKey(this,&local_1d4,2,index);
        sec = local_180;
      }
      goto LAB_004e6b60;
    }
    iVar7 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x113].Text);
    FTagManager::AddSectorTag(&tagManager,index,iVar7);
  } while( true );
  uVar8 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,FName::NameData.NameArray[0xe6].Text)
  ;
  uVar5 = (ushort)uVar8;
  sec->special = uVar5;
  if (this->isTranslated == true) {
    iVar7 = P_TranslateSectorSpecial((int)(short)uVar5);
    sec->special = (short)iVar7;
  }
  else if (((this->super_UDMFParserBase).namespc.Index == 10) &&
          ((0xff < uVar5 || ("\x01\x01\x01\x01\x01"[uVar8 & 0xff] == '\0')))) {
    sec->special = 0;
  }
  goto LAB_004e6b60;
}

Assistant:

void ParseSector(sector_t *sec, int index)
	{
		int lightcolor = -1;
		int fadecolor = -1;
		int desaturation = -1;
		int fplaneflags = 0, cplaneflags = 0;
		double fp[4] = { 0 }, cp[4] = { 0 };
		FString tagstring;

		memset(sec, 0, sizeof(*sec));
		sec->lightlevel = 160;
		sec->SetXScale(sector_t::floor, 1.);	// [RH] floor and ceiling scaling
		sec->SetYScale(sector_t::floor, 1.);
		sec->SetXScale(sector_t::ceiling, 1.);
		sec->SetYScale(sector_t::ceiling, 1.);
		sec->SetAlpha(sector_t::floor, 1.);
		sec->SetAlpha(sector_t::ceiling, 1.);
		sec->thinglist = NULL;
		sec->touching_thinglist = NULL;		// phares 3/14/98
		sec->render_thinglist = NULL;
		sec->seqType = (level.flags & LEVEL_SNDSEQTOTALCTRL) ? 0 : -1;
		sec->nextsec = -1;	//jff 2/26/98 add fields to support locking out
		sec->prevsec = -1;	// stair retriggering until build completes
		sec->heightsec = NULL;	// sector used to get floor and ceiling height
		sec->sectornum = index;
		sec->damageinterval = 32;
		sec->terrainnum[sector_t::ceiling] = sec->terrainnum[sector_t::floor] = -1;
		if (floordrop) sec->Flags = SECF_FLOORDROP;
		// killough 3/7/98: end changes

		sec->gravity = 1.;	// [RH] Default sector gravity of 1.0
		sec->ZoneNumber = 0xFFFF;

		// killough 8/28/98: initialize all sectors to normal friction
		sec->friction = ORIG_FRICTION;
		sec->movefactor = ORIG_FRICTION_FACTOR;

		sc.MustGetToken('{');
		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch(key)
			{
			case NAME_Heightfloor:
				sec->SetPlaneTexZ(sector_t::floor, CheckFloat(key));
				continue;

			case NAME_Heightceiling:
				sec->SetPlaneTexZ(sector_t::ceiling, CheckFloat(key));
				continue;

			case NAME_Texturefloor:
				SetTexture(sec, index, sector_t::floor, CheckString(key), missingTex, false);
				continue;

			case NAME_Textureceiling:
				SetTexture(sec, index, sector_t::ceiling, CheckString(key), missingTex, false);
				continue;

			case NAME_Lightlevel:
				sec->lightlevel = sector_t::ClampLight(CheckInt(key));
				continue;

			case NAME_Special:
				sec->special = (short)CheckInt(key);
				if (isTranslated) sec->special = P_TranslateSectorSpecial(sec->special);
				else if (namespc == NAME_Hexen)
				{
					if (sec->special < 0 || sec->special > 255 || !HexenSectorSpecialOk[sec->special])
						sec->special = 0;	// NULL all unknown specials
				}
				continue;

			case NAME_Id:
				tagManager.AddSectorTag(index, CheckInt(key));
				continue;

			default:
				break;
			}

			if (namespace_bits & (Zd|Zdt|Va)) switch(key)
			{
				case NAME_Xpanningfloor:
					sec->SetXOffset(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Ypanningfloor:
					sec->SetYOffset(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Xpanningceiling:
					sec->SetXOffset(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Ypanningceiling:
					sec->SetYOffset(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Xscalefloor:
					sec->SetXScale(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Yscalefloor:
					sec->SetYScale(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Xscaleceiling:
					sec->SetXScale(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Yscaleceiling:
					sec->SetYScale(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Rotationfloor:
					sec->SetAngle(sector_t::floor, CheckAngle(key));
					continue;

				case NAME_Rotationceiling:
					sec->SetAngle(sector_t::ceiling, CheckAngle(key));
					continue;

				case NAME_Lightfloor:
					sec->SetPlaneLight(sector_t::floor, CheckInt(key));
					continue;

				case NAME_Lightceiling:
					sec->SetPlaneLight(sector_t::ceiling, CheckInt(key));
					continue;

				case NAME_Alphafloor:
					sec->SetAlpha(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Alphaceiling:
					sec->SetAlpha(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Renderstylefloor:
				{
					const char *str = CheckString(key);
					if (!stricmp(str, "translucent")) sec->ChangeFlags(sector_t::floor, PLANEF_ADDITIVE, 0);
					else if (!stricmp(str, "add")) sec->ChangeFlags(sector_t::floor, 0, PLANEF_ADDITIVE);
					else sc.ScriptMessage("Unknown value \"%s\" for 'renderstylefloor'\n", str);
					continue;
				}

				case NAME_Renderstyleceiling:
				{
					const char *str = CheckString(key);
					if (!stricmp(str, "translucent")) sec->ChangeFlags(sector_t::ceiling, PLANEF_ADDITIVE, 0);
					else if (!stricmp(str, "add")) sec->ChangeFlags(sector_t::ceiling, 0, PLANEF_ADDITIVE);
					else sc.ScriptMessage("Unknown value \"%s\" for 'renderstyleceiling'\n", str);
					continue;
				}

				case NAME_Lightfloorabsolute:
					if (CheckBool(key)) sec->ChangeFlags(sector_t::floor, 0, PLANEF_ABSLIGHTING);
					else sec->ChangeFlags(sector_t::floor, PLANEF_ABSLIGHTING, 0);
					continue;

				case NAME_Lightceilingabsolute:
					if (CheckBool(key)) sec->ChangeFlags(sector_t::ceiling, 0, PLANEF_ABSLIGHTING);
					else sec->ChangeFlags(sector_t::ceiling, PLANEF_ABSLIGHTING, 0);
					continue;

				case NAME_Gravity:
					sec->gravity = CheckFloat(key);
					continue;

				case NAME_Lightcolor:
					lightcolor = CheckInt(key);
					continue;

				case NAME_Fadecolor:
					fadecolor = CheckInt(key);
					continue;

				case NAME_Desaturation:
					desaturation = int(255*CheckFloat(key));
					continue;

				case NAME_Silent:
					Flag(sec->Flags, SECF_SILENT, key);
					continue;

				case NAME_NoRespawn:
					Flag(sec->Flags, SECF_NORESPAWN, key);
					continue;

				case NAME_Nofallingdamage:
					Flag(sec->Flags, SECF_NOFALLINGDAMAGE, key);
					continue;

				case NAME_Dropactors:
					Flag(sec->Flags, SECF_FLOORDROP, key);
					continue;

				case NAME_SoundSequence:
					sec->SeqName = CheckString(key);
					sec->seqType = -1;
					continue;

				case NAME_hidden:
					Flag(sec->MoreFlags, SECF_HIDDEN, key);
					break;

				case NAME_Waterzone:
					Flag(sec->MoreFlags, SECF_UNDERWATER, key);
					break;

				case NAME_floorplane_a:
					fplaneflags |= 1;
					fp[0] = CheckFloat(key);
					break;

				case NAME_floorplane_b:
					fplaneflags |= 2;
					fp[1] = CheckFloat(key);
					break;

				case NAME_floorplane_c:
					fplaneflags |= 4;
					fp[2] = CheckFloat(key);
					break;

				case NAME_floorplane_d:
					fplaneflags |= 8;
					fp[3] = CheckFloat(key);
					break;

				case NAME_ceilingplane_a:
					cplaneflags |= 1;
					cp[0] = CheckFloat(key);
					break;

				case NAME_ceilingplane_b:
					cplaneflags |= 2;
					cp[1] = CheckFloat(key);
					break;

				case NAME_ceilingplane_c:
					cplaneflags |= 4;
					cp[2] = CheckFloat(key);
					break;

				case NAME_ceilingplane_d:
					cplaneflags |= 8;
					cp[3] = CheckFloat(key);
					break;

				case NAME_damageamount:
					sec->damageamount = CheckInt(key);
					break;

				case NAME_damagetype:
					sec->damagetype = CheckString(key);
					break;

				case NAME_damageinterval:
					sec->damageinterval = CheckInt(key);
					if (sec->damageinterval < 1) sec->damageinterval = 1;
					break;

				case NAME_leakiness:
					sec->leakydamage = CheckInt(key);
					break;

				case NAME_damageterraineffect:
					Flag(sec->Flags, SECF_DMGTERRAINFX, key);
					break;

				case NAME_damagehazard:
					Flag(sec->Flags, SECF_HAZARD, key);
					break;

				case NAME_floorterrain:
					sec->terrainnum[sector_t::floor] = P_FindTerrain(CheckString(key));
					break;

				case NAME_ceilingterrain:
					sec->terrainnum[sector_t::ceiling] = P_FindTerrain(CheckString(key));
					break;

				case NAME_MoreIds:
					// delay parsing of the tag string until parsing of the sector is complete
					// This ensures that the ID is always the first tag in the list.
					tagstring = CheckString(key);
					break;

				default:
					break;
			}
			if ((namespace_bits & (Zd | Zdt)) && !strnicmp("user_", key.GetChars(), 5))
			{
				AddUserKey(key, UDMF_Sector, index);
			}
		}

		if (tagstring.IsNotEmpty())
		{
			FScanner sc;
			sc.OpenString("tagstring", tagstring);
			// scan the string as long as valid numbers can be found
			while (sc.CheckNumber())
			{
				if (sc.Number != 0)	tagManager.AddSectorTag(index, sc.Number);
			}
		}

		if (sec->damageamount == 0)
		{
			// If no damage is set, clear all other related properties so that they do not interfere
			// with other means of setting them.
			sec->damagetype = NAME_None;
			sec->damageinterval = 0;
			sec->leakydamage = 0;
			sec->Flags &= ~SECF_DAMAGEFLAGS;
		}
		
		// Reset the planes to their defaults if not all of the plane equation's parameters were found.
		if (fplaneflags != 15)
		{
			sec->floorplane.SetAtHeight(sec->GetPlaneTexZ(sector_t::floor), sector_t::floor);
		}
		else
		{
			// normalize the vector, it must have a length of 1
			DVector3 n = DVector3(fp[0], fp[1], fp[2]).Unit();
			sec->floorplane.set(n.X, n.Y, n.Z, fp[3]);
		}
		if (cplaneflags != 15)
		{
			sec->ceilingplane.SetAtHeight(sec->GetPlaneTexZ(sector_t::ceiling), sector_t::ceiling);
		}
		else
		{
			DVector3 n = DVector3(cp[0], cp[1], cp[2]).Unit();
			sec->ceilingplane.set(n.X, n.Y, n.Z, cp[3]);
		}

		if (lightcolor == -1 && fadecolor == -1 && desaturation == -1)
		{
			// [RH] Sectors default to white light with the default fade.
			//		If they are outside (have a sky ceiling), they use the outside fog.
			if (level.outsidefog != 0xff000000 && (sec->GetTexture(sector_t::ceiling) == skyflatnum || (sec->special & 0xff) == Sector_Outside))
			{
				if (fogMap == NULL)
					fogMap = GetSpecialLights(PalEntry(255, 255, 255), level.outsidefog, 0);
				sec->ColorMap = fogMap;
			}
			else
			{
				if (normMap == NULL)
					normMap = GetSpecialLights (PalEntry (255,255,255), level.fadeto, NormalLight.Desaturate);
				sec->ColorMap = normMap;
			}
		}
		else
		{
			if (lightcolor == -1) lightcolor = PalEntry(255,255,255);
			if (fadecolor == -1)
			{
				if (level.outsidefog != 0xff000000 && (sec->GetTexture(sector_t::ceiling) == skyflatnum || (sec->special & 0xff) == Sector_Outside))
					fadecolor = level.outsidefog;
				else
					fadecolor = level.fadeto;
			}
			if (desaturation == -1) desaturation = NormalLight.Desaturate;

			sec->ColorMap = GetSpecialLights (lightcolor, fadecolor, desaturation);
		}
	}